

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NetStrengthSyntax*&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::TimingControlSyntax*&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NetStrengthSyntax **args_2,Token *args_3,DataTypeSyntax *args_4,
          TimingControlSyntax **args_5,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_6,
          Token *args_7)

{
  Token netType;
  Token expansionHint;
  Token semi;
  NetDeclarationSyntax *this_00;
  
  this_00 = (NetDeclarationSyntax *)allocate(this,0xb8,8);
  netType.kind = args_1->kind;
  netType._2_1_ = args_1->field_0x2;
  netType.numFlags.raw = (args_1->numFlags).raw;
  netType.rawLen = args_1->rawLen;
  netType.info = args_1->info;
  semi.kind = args_7->kind;
  semi._2_1_ = args_7->field_0x2;
  semi.numFlags.raw = (args_7->numFlags).raw;
  semi.rawLen = args_7->rawLen;
  semi.info = args_7->info;
  expansionHint.kind = args_3->kind;
  expansionHint._2_1_ = args_3->field_0x2;
  expansionHint.numFlags.raw = (args_3->numFlags).raw;
  expansionHint.rawLen = args_3->rawLen;
  expansionHint.info = args_3->info;
  slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
            (this_00,args,netType,*args_2,expansionHint,args_4,*args_5,args_6,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }